

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMEntityImpl::DOMEntityImpl(DOMEntityImpl *this,DOMEntityImpl *other,bool deep)

{
  XMLCh *pXVar1;
  
  (this->super_DOMEntity).super_DOMNode._vptr_DOMNode = (_func_int **)&PTR__DOMEntityImpl_00404bc8;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl = (_func_int **)&PTR__DOMEntityImpl_00404d98;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl = (_func_int **)&PTR__DOMEntityImpl_00404dc8
  ;
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,&other->fNode);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,&other->fParent);
  pXVar1 = other->fPublicId;
  this->fName = other->fName;
  this->fPublicId = pXVar1;
  pXVar1 = other->fNotationName;
  this->fSystemId = other->fSystemId;
  this->fNotationName = pXVar1;
  pXVar1 = other->fInputEncoding;
  this->fRefEntity = other->fRefEntity;
  this->fInputEncoding = pXVar1;
  pXVar1 = other->fXmlVersion;
  this->fXmlEncoding = other->fXmlEncoding;
  this->fXmlVersion = pXVar1;
  this->fBaseURI = other->fBaseURI;
  this->fEntityRefNodeCloned = false;
  if (deep) {
    DOMParentNode::cloneChildren(&this->fParent,(DOMNode *)other);
  }
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityImpl::DOMEntityImpl(const DOMEntityImpl &other, bool deep)
    : DOMEntity(other),
      fNode(this, other.fNode),
      fParent(this, other.fParent),
      fName(other.fName),
      fPublicId(other.fPublicId),
      fSystemId(other.fSystemId),
      fNotationName(other.fNotationName),
      fRefEntity(other.fRefEntity),
      fInputEncoding(other.fInputEncoding),
      fXmlEncoding(other.fXmlEncoding),
      fXmlVersion(other.fXmlVersion),
      fBaseURI(other.fBaseURI),
      fEntityRefNodeCloned(false)
{
    if (deep)
        fParent.cloneChildren(&other);
    fNode.setReadOnly(true, true);
}